

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Info * re2::Prefilter::Info::Literal(Rune r)

{
  Rune r_00;
  Info *this;
  re2 local_48 [48];
  Info *local_18;
  Info *info;
  Rune r_local;
  
  info._4_4_ = r;
  this = (Info *)operator_new(0x40);
  Info(this);
  local_18 = this;
  r_00 = ToLowerRune(info._4_4_);
  RuneToString_abi_cxx11_(local_48,r_00);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,(value_type *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  local_18->is_exact_ = true;
  return local_18;
}

Assistant:

Prefilter::Info* Prefilter::Info::Literal(Rune r) {
  Info* info = new Info();
  info->exact_.insert(RuneToString(ToLowerRune(r)));
  info->is_exact_ = true;
  return info;
}